

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

bool ImGui::BeginMenuEx(char *label,char *icon,bool enabled)

{
  ImVec2 IVar1;
  int iVar2;
  int iVar3;
  ImGuiWindow *this;
  uint *puVar4;
  ImDrawList *draw_list;
  ImGuiPopupData *pIVar5;
  ImVec2 IVar6;
  ImGuiContext *pIVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ImGuiID id;
  ImU32 col;
  uint *puVar11;
  int iVar12;
  ImGuiWindow *pIVar13;
  uint *puVar14;
  byte bVar15;
  int iVar16;
  byte bVar17;
  uint uVar18;
  float fVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  float fVar20;
  float fVar21;
  float fVar22;
  ImVec2 IVar23;
  float fVar24;
  ImVec2 ta;
  ImVec2 tb;
  ImVec2 tc;
  ImVec2 local_c8;
  ImVec2 local_c0;
  undefined1 local_b8 [12];
  float fStack_ac;
  undefined1 local_a8 [16];
  uint local_98;
  uint local_94;
  char *local_90;
  undefined1 local_88 [16];
  ImGuiWindow *local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  undefined8 uStack_60;
  float local_58;
  float fStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 local_48 [16];
  ImVec2 local_38;
  
  pIVar7 = GImGui;
  this = GImGui->CurrentWindow;
  this->WriteAccessed = true;
  if (this->SkipItems != false) {
    return false;
  }
  local_90 = icon;
  id = ImGuiWindow::GetID(this,label,(char *)0x0);
  bVar8 = IsPopupOpen(id,0);
  local_94 = (uint)((*(byte *)((long)&this->Flags + 3) & 0x10) >> 4) << 0x18 | 0x10080145;
  puVar11 = (pIVar7->MenusIdSubmittedThisFrame).Data;
  iVar2 = (pIVar7->MenusIdSubmittedThisFrame).Size;
  puVar4 = puVar11 + iVar2;
  do {
    puVar14 = puVar11;
    if (puVar4 <= puVar14) goto LAB_0016b28e;
    puVar11 = puVar14 + 1;
  } while (*puVar14 != id);
  if (puVar14 < puVar4) {
    if (bVar8) {
      bVar8 = BeginPopupEx(id,local_94);
      return bVar8;
    }
    (pIVar7->NextWindowData).Flags = 0;
    return bVar8;
  }
LAB_0016b28e:
  iVar3 = (pIVar7->MenusIdSubmittedThisFrame).Capacity;
  if (iVar2 == iVar3) {
    if (iVar3 == 0) {
      iVar12 = 8;
    }
    else {
      iVar12 = iVar3 / 2 + iVar3;
    }
    iVar16 = iVar2 + 1;
    if (iVar2 + 1 < iVar12) {
      iVar16 = iVar12;
    }
    if (iVar3 < iVar16) {
      puVar11 = (uint *)MemAlloc((long)iVar16 << 2);
      puVar4 = (pIVar7->MenusIdSubmittedThisFrame).Data;
      if (puVar4 != (uint *)0x0) {
        memcpy(puVar11,puVar4,(long)(pIVar7->MenusIdSubmittedThisFrame).Size << 2);
        MemFree((pIVar7->MenusIdSubmittedThisFrame).Data);
      }
      (pIVar7->MenusIdSubmittedThisFrame).Data = puVar11;
      (pIVar7->MenusIdSubmittedThisFrame).Capacity = iVar16;
    }
  }
  (pIVar7->MenusIdSubmittedThisFrame).Data[(pIVar7->MenusIdSubmittedThisFrame).Size] = id;
  (pIVar7->MenusIdSubmittedThisFrame).Size = (pIVar7->MenusIdSubmittedThisFrame).Size + 1;
  IVar6 = CalcTextSize(label,(char *)0x0,true,-1.0);
  local_a8._8_4_ = extraout_XMM0_Dc;
  local_a8._0_4_ = IVar6.x;
  local_a8._4_4_ = IVar6.y;
  local_a8._12_4_ = extraout_XMM0_Dd;
  bVar9 = IsRootOfOpenMenuSet();
  local_78 = pIVar7->NavWindow;
  if (bVar9) {
    pIVar7->NavWindow = this;
  }
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  fVar19 = (this->DC).CursorPos.x;
  _local_b8 = ZEXT416((uint)(this->DC).CursorPos.y);
  PushID(label);
  if (!enabled) {
    BeginDisabled(true);
  }
  local_88 = ZEXT416((uint)fVar19);
  uVar18 = (uint)bVar8;
  if ((this->DC).LayoutType == 0) {
    local_88 = ZEXT416((uint)((fVar19 + -1.0) - (float)(int)((pIVar7->Style).ItemSpacing.x * 0.5)));
    local_b8._0_4_ = (float)local_b8._0_4_ - (pIVar7->Style).FramePadding.y;
    fVar19 = ImGuiWindow::MenuBarHeight(this);
    local_c0.y = fVar19 + (float)local_b8._0_4_;
    local_c0.x = (float)local_88._0_4_;
    fVar19 = (pIVar7->Style).ItemSpacing.x;
    (this->DC).CursorPos.x = (float)(int)(fVar19 * 0.5) + (this->DC).CursorPos.x;
    local_c8.y = (pIVar7->Style).ItemSpacing.y;
    local_c8.x = fVar19 + fVar19;
    PushStyleVar(0xe,&local_c8);
    IVar6 = (this->DC).CursorPos;
    local_b8._4_4_ = (this->DC).CurrLineTextBaseOffset + IVar6.y;
    local_b8._0_4_ = (float)(this->DC).MenuColumns.OffsetLabel + IVar6.x;
    stack0xffffffffffffff50 = 0;
    local_c8.y = 0.0;
    local_c8.x = (float)local_a8._0_4_;
    bVar10 = Selectable("",bVar8,0x500001,&local_c8);
    local_a8[0] = bVar10;
    RenderText((ImVec2)local_b8._0_8_,label,(char *)0x0,true);
    PopStyleVar(1);
    (this->DC).CursorPos.x =
         (float)(int)((pIVar7->Style).ItemSpacing.x * -0.5) + (this->DC).CursorPos.x;
  }
  else {
    local_c0.y = (float)local_b8._0_4_ - (pIVar7->Style).WindowPadding.y;
    local_c0.x = fVar19;
    local_58 = 0.0;
    fStack_54 = 0.0;
    uStack_50 = 0;
    uStack_4c = 0;
    local_98 = uVar18;
    if ((local_90 != (char *)0x0) && (*local_90 != '\0')) {
      IVar6 = CalcTextSize(local_90,(char *)0x0,false,-1.0);
      local_58 = IVar6.x;
      fStack_54 = IVar6.y;
      uStack_50 = extraout_XMM0_Dc_00;
      uStack_4c = extraout_XMM0_Dd_00;
    }
    fVar19 = ImGuiMenuColumns::DeclColumns
                       (&(this->DC).MenuColumns,local_58,(float)local_a8._0_4_,0.0,
                        (float)(int)(pIVar7->FontSize * 1.2));
    local_a8._0_4_ = fVar19;
    IVar6 = GetContentRegionAvail();
    fVar19 = IVar6.x - (float)local_a8._0_4_;
    local_48 = ZEXT416(~-(uint)(fVar19 <= 0.0) & (uint)fVar19);
    IVar6 = (this->DC).CursorPos;
    local_68.x = (float)(this->DC).MenuColumns.OffsetLabel + IVar6.x;
    local_68.y = (this->DC).CurrLineTextBaseOffset + IVar6.y;
    uStack_60 = 0;
    local_c8.y = 0.0;
    local_c8.x = (float)local_a8._0_4_;
    bVar10 = Selectable("",SUB41(local_98,0),0x1500001,&local_c8);
    local_a8[0] = bVar10;
    RenderText(local_68,label,(char *)0x0,true);
    if (0.0 < local_58) {
      IVar6.y = (float)local_b8._0_4_ + 0.0;
      IVar6.x = (float)(this->DC).MenuColumns.OffsetIcon + (float)local_88._0_4_;
      RenderText(IVar6,local_90,(char *)0x0,true);
    }
    draw_list = this->DrawList;
    fStack_ac = (float)local_b8._4_4_ + 0.0;
    local_b8._4_4_ = (float)local_b8._0_4_ + 0.0;
    local_b8._0_4_ =
         (float)local_88._0_4_ +
         pIVar7->FontSize * 0.3 + (float)local_48._0_4_ + (float)(this->DC).MenuColumns.OffsetMark;
    local_b8._8_4_ = 0;
    col = GetColorU32(0,1.0);
    RenderArrow(draw_list,(ImVec2)local_b8._0_8_,col,1,1.0);
  }
  if (!enabled) {
    EndDisabled();
  }
  if (enabled && pIVar7->HoveredId == id) {
    bVar17 = pIVar7->NavDisableMouseHover ^ 1;
  }
  else {
    bVar17 = 0;
  }
  if (bVar9) {
    pIVar7->NavWindow = local_78;
  }
  if ((this->DC).LayoutType == 1) {
    iVar2 = (pIVar7->BeginPopupStack).Size;
    if ((iVar2 < (pIVar7->OpenPopupStack).Size) &&
       (pIVar5 = (pIVar7->OpenPopupStack).Data, pIVar5[iVar2].SourceWindow == this)) {
      pIVar13 = pIVar5[iVar2].Window;
    }
    else {
      pIVar13 = (ImGuiWindow *)0x0;
    }
    bVar9 = true;
    if (((pIVar7->HoveredWindow == this) && (pIVar13 != (ImGuiWindow *)0x0)) &&
       ((this->Flags & 0x400) == 0)) {
      fVar19 = pIVar7->FontSize;
      local_38.x = (pIVar13->Pos).x;
      fVar22 = (pIVar13->Pos).y;
      fVar20 = (pIVar13->Size).x + local_38.x;
      IVar23 = pIVar13->Pos;
      IVar6 = (pIVar7->IO).MousePos;
      IVar1 = (pIVar7->IO).MouseDelta;
      fVar24 = IVar6.x - IVar1.x;
      local_c8.y = IVar6.y - IVar1.y;
      bVar9 = local_38.x != (this->Pos).x;
      bVar10 = (this->Pos).x <= local_38.x;
      if (!bVar10 || !bVar9) {
        IVar23.y = fVar22;
        IVar23.x = fVar20;
        local_38.x = fVar20;
      }
      local_70.x = IVar23.x;
      fVar21 = ABS(fVar24 - local_70.x) * 0.3;
      fVar20 = fVar19 * 2.5;
      if (fVar21 <= fVar19 * 2.5) {
        fVar20 = fVar21;
      }
      uVar18 = -(uint)(fVar21 < fVar19 * 0.5);
      fVar20 = (float)(uVar18 & (uint)(fVar19 * 0.5) | ~uVar18 & (uint)fVar20);
      local_c8.x = fVar24 + *(float *)(&DAT_00191f10 + (ulong)(bVar10 && bVar9) * 4);
      local_70.y = IVar23.y;
      fVar24 = (local_70.y - fVar20) - local_c8.y;
      uVar18 = -(uint)(fVar19 * -8.0 <= fVar24);
      local_70.y = (float)(~uVar18 & (uint)(fVar19 * -8.0) | (uint)fVar24 & uVar18) + local_c8.y;
      fVar22 = ((pIVar13->Size).y + fVar22 + fVar20) - local_c8.y;
      if (fVar19 * 8.0 <= fVar22) {
        fVar22 = fVar19 * 8.0;
      }
      local_38.y = fVar22 + local_c8.y;
      bVar9 = ImTriangleContainsPoint(&local_c8,&local_70,&local_38,&(pIVar7->IO).MousePos);
      bVar9 = !bVar9;
    }
    if ((((~bVar8 | bVar17) & 1) == 0) && (pIVar7->HoveredWindow == this)) {
      bVar15 = (pIVar7->HoveredIdPreviousFrame != id && pIVar7->HoveredIdPreviousFrame != 0) & bVar9
      ;
    }
    else {
      bVar15 = 0;
    }
    bVar10 = (bool)(!bVar8 & local_a8[0]);
    if ((bVar17 & 1) == 0) {
      bVar9 = bVar10;
    }
    if (local_a8[0] != 0) {
      bVar9 = bVar10;
    }
    if (bVar8) {
      bVar9 = bVar10;
    }
    if ((pIVar7->NavId != id) || (pIVar7->NavMoveDir != 1)) goto LAB_0016b9e4;
  }
  else {
    if (local_a8[0] != 0) {
      bVar15 = bVar9 & local_a8[0] & bVar8;
      bVar9 = (bool)(bVar15 ^ 1);
      bVar8 = (bool)(bVar8 ^ bVar15);
      goto LAB_0016b9e4;
    }
    if ((byte)(bVar8 | bVar9 & bVar17 ^ 1) != 1) {
      bVar9 = true;
      bVar15 = 0;
      goto LAB_0016b9e4;
    }
    if (pIVar7->NavId != id) {
      bVar9 = false;
      bVar15 = 0;
      goto LAB_0016b9e4;
    }
    bVar15 = 0;
    if (pIVar7->NavMoveDir != 3) {
      bVar9 = false;
      goto LAB_0016b9e4;
    }
  }
  NavMoveRequestCancel();
  bVar9 = true;
LAB_0016b9e4:
  if (((!enabled) || (bVar15 != 0)) && (bVar10 = IsPopupOpen(id,0), bVar10)) {
    ClosePopupToLevel((pIVar7->BeginPopupStack).Size,true);
  }
  PopID();
  if (((~bVar9 & 1U) == 0 && bVar8 == false) &&
     ((pIVar7->BeginPopupStack).Size < (pIVar7->OpenPopupStack).Size)) {
    OpenPopup(label,0);
    return false;
  }
  if (bVar9 != false) {
    OpenPopup(label,0);
  }
  uVar18 = local_94;
  if (bVar8 == false && bVar9 == false) {
    (pIVar7->NextWindowData).Flags = 0;
    return false;
  }
  local_c8.x = 0.0;
  local_c8.y = 0.0;
  SetNextWindowPos(&local_c0,1,&local_c8);
  PushStyleVar(7,(pIVar7->Style).PopupRounding);
  bVar8 = BeginPopupEx(id,uVar18);
  PopStyleVar(1);
  return bVar8;
}

Assistant:

bool ImGui::DragFloatRange2(const char* label, float* v_current_min, float* v_current_max, float v_speed, float v_min, float v_max, const char* format, const char* format_max, ImGuiSliderFlags flags)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return false;

    ImGuiContext& g = *GImGui;
    PushID(label);
    BeginGroup();
    PushMultiItemsWidths(2, CalcItemWidth());

    float min_min = (v_min >= v_max) ? -FLT_MAX : v_min;
    float min_max = (v_min >= v_max) ? *v_current_max : ImMin(v_max, *v_current_max);
    ImGuiSliderFlags min_flags = flags | ((min_min == min_max) ? ImGuiSliderFlags_ReadOnly : 0);
    bool value_changed = DragScalar("##min", ImGuiDataType_Float, v_current_min, v_speed, &min_min, &min_max, format, min_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    float max_min = (v_min >= v_max) ? *v_current_min : ImMax(v_min, *v_current_min);
    float max_max = (v_min >= v_max) ? FLT_MAX : v_max;
    ImGuiSliderFlags max_flags = flags | ((max_min == max_max) ? ImGuiSliderFlags_ReadOnly : 0);
    value_changed |= DragScalar("##max", ImGuiDataType_Float, v_current_max, v_speed, &max_min, &max_max, format_max ? format_max : format, max_flags);
    PopItemWidth();
    SameLine(0, g.Style.ItemInnerSpacing.x);

    TextEx(label, FindRenderedTextEnd(label));
    EndGroup();
    PopID();

    return value_changed;
}